

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O0

void Set_XCursor(int x,int y)

{
  DLword *bitmap;
  int local_2c;
  int i;
  DLword *newbm;
  MXCURSOR *clbp;
  MXCURSOR *clp;
  int y_local;
  int x_local;
  
  newbm = (DLword *)0x0;
  bitmap = IOPage->dlcursorbitmap;
  for (clbp = cursorlist; clbp != (MXCURSOR *)0x0; clbp = clbp->next) {
    for (local_2c = 0; (local_2c < 0x10 && (clbp->bitmap[local_2c] == bitmap[local_2c]));
        local_2c = local_2c + 1) {
    }
    if (local_2c == 0x10) break;
    newbm = (DLword *)clbp;
  }
  if (clbp == (MXCURSOR *)0x0) {
    clbp = (MXCURSOR *)malloc(0x30);
    for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
      clbp->bitmap[local_2c] = bitmap[local_2c];
    }
    set_Xcursor(currentdsp,(uint8_t *)bitmap,x,0xf - y,&clbp->Xid,1);
    clbp->next = cursorlist;
    cursorlist = clbp;
  }
  else if (clbp != cursorlist) {
    *(MXCURSOR **)newbm = clbp->next;
    clbp->next = cursorlist;
    cursorlist = clbp;
  }
  XDefineCursor(currentdsp->display_id,currentdsp->DisplayWindow,clbp->Xid);
  Current_Hot_X = x;
  Current_Hot_Y = 0xf - y;
  return;
}

Assistant:

void Set_XCursor(int x, int y)
{
  /* compare cursor in IOPage memory with cursors we've seen before */
  struct MXCURSOR *clp, *clbp = NULL;
  DLword *newbm = ((DLword *)(IOPage->dlcursorbitmap));
  int i;

  XLOCK; /* No signals while setting the cursor */
  for (clp = cursorlist; clp != NULL; clbp = clp, clp = clp->next) {
    for (i = 0; i < CURSORHEIGHT; i++)
      if (clp->bitmap[i] != newbm[i]) break;
    if (i == CURSORHEIGHT) break;
  }

  if (clp == NULL) { /* it isn't there, push on a new one */
    clp = (struct MXCURSOR *)malloc(sizeof(struct MXCURSOR));
    /* and fill it up with the current new cursor */
    for (i = 0; i < CURSORHEIGHT; i++) clp->bitmap[i] = newbm[i];
#ifdef NEWXCURSOR
    /* JDS 000521 Added "15-" to fix cursor troubles at window edge */
    set_Xcursor(currentdsp, (uint8_t *)newbm, x, 15 - y, &(clp->Xid), 1);
#else
    set_Xcursor(currentdsp, (uint8_t *)newbm, 0, 0, &(clp->Xid), 1);
#endif /* NEWXCURSOR */
    clp->next = cursorlist;
    cursorlist = clp;
  } else
      /* found it, move it to the front of the list
         (this should reduce search time on the average by keeping
         the popular cursors near the front of the list)
         */
      if (clp != cursorlist) { /* don't move if it's already there */
    clbp->next = clp->next;
    clp->next = cursorlist;
    cursorlist = clp;
  }
  DefineCursor(currentdsp, currentdsp->DisplayWindow, &(clp->Xid));
  XUNLOCK(currentdsp); /* Signals OK now */

#ifdef NEWXCURSOR
  /* Save the hotspot for later position reporting/setting */

  Current_Hot_X = x;
  Current_Hot_Y = 15 - y; /* Added 15- to fix window-edge trouble */
#endif                    /* NEWXCURSOR */

}